

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

double __thiscall
ImGui::RoundScalarWithFormatT<double,double>
          (ImGui *this,char *format,ImGuiDataType data_type,double v)

{
  ImGui IVar1;
  char cVar2;
  ImGui *in_RAX;
  ImGui *pIVar3;
  char cVar4;
  int iVar5;
  undefined4 in_register_00000014;
  size_t fmt_out_size;
  long lVar6;
  char *__nptr;
  char *pcVar7;
  char fmt_sanitized [32];
  char v_str [64];
  char local_78 [32];
  char local_58 [64];
  
  fmt_out_size = CONCAT44(in_register_00000014,data_type);
  do {
    IVar1 = *this;
    fmt_out_size = CONCAT71((int7)(fmt_out_size >> 8),IVar1);
    if (IVar1 == (ImGui)0x0) {
      iVar5 = 3;
      pIVar3 = in_RAX;
    }
    else if ((IVar1 != (ImGui)0x25) || (iVar5 = 1, pIVar3 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar1 == (ImGui)0x25) + 1;
      iVar5 = 0;
      pIVar3 = in_RAX;
    }
    in_RAX = pIVar3;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    this = pIVar3;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    SanitizeFormatString((char *)this,local_78,fmt_out_size);
    ImFormatString(local_58,0x40,local_78,v);
    pcVar7 = local_58;
    do {
      __nptr = pcVar7;
      cVar2 = *__nptr;
      pcVar7 = __nptr + 1;
    } while (cVar2 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      v = atof(__nptr);
    }
    else {
      lVar6 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
      cVar4 = __nptr[lVar6];
      v = 0.0;
      if ((byte)(cVar4 - 0x30U) < 10) {
        pcVar7 = __nptr + 1 + lVar6;
        do {
          v = v * 10.0 + (double)(byte)(cVar4 - 0x30);
          cVar4 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while ((byte)(cVar4 - 0x30U) < 10);
      }
      if (cVar2 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}